

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O1

Instr * __thiscall
GlobOpt::SetTypeCheckBailOut(GlobOpt *this,Opnd *opnd,Instr *instr,BailOutInfo *bailOutInfo)

{
  code *pcVar1;
  PropertySymOpnd *pPVar2;
  OpndKind OVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  BailOutKind BVar7;
  undefined4 *puVar8;
  PropertySymOpnd *pPVar9;
  JITTimeFunctionBody *pJVar10;
  FunctionJITTimeInfo *pFVar11;
  char *message;
  char *error;
  undefined1 local_68 [8];
  anon_class_32_4_595ba12a HandleBailout;
  BailOutInfo *bailOutInfo_local;
  undefined1 auStack_38 [4];
  BailOutKind bailOutKind;
  PropertySymOpnd *propertySymOpnd;
  Instr *instr_local;
  bool isTypeCheckProtected;
  
  if (this->prePassLoop != (Loop *)0x0) {
    return instr;
  }
  HandleBailout.propertySymOpnd = (PropertySymOpnd **)bailOutInfo;
  propertySymOpnd = (PropertySymOpnd *)instr;
  OVar3 = IR::Opnd::GetKind(opnd);
  if (OVar3 != OpndKindSym) {
    return (Instr *)propertySymOpnd;
  }
  OVar3 = IR::Opnd::GetKind(opnd);
  if (OVar3 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar4) goto LAB_004a41b2;
    *puVar8 = 0;
  }
  bVar4 = IR::SymOpnd::IsPropertySymOpnd((SymOpnd *)opnd);
  if (!bVar4) {
    return (Instr *)propertySymOpnd;
  }
  pPVar9 = IR::Opnd::AsPropertySymOpnd(opnd);
  _auStack_38 = pPVar9;
  bVar4 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(pPVar9);
  if ((!bVar4) && (((pPVar9->field_12).field_0.field_5.typeCheckSeqFlags & 0x4e) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x6ca,"(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate())",
                       "Property sym operand optimized despite not being a candidate?");
    if (!bVar4) goto LAB_004a41b2;
    *puVar8 = 0;
  }
  if ((HandleBailout.propertySymOpnd != (PropertySymOpnd **)0x0) &&
     (((ulong)propertySymOpnd->objTypeSpecFldInfo & 0x10) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x6cb,"(bailOutInfo == nullptr || !instr->HasBailOutInfo())",
                       "Why are we adding new bailout info to an instruction that already has it?");
    if (!bVar4) goto LAB_004a41b2;
    *puVar8 = 0;
  }
  local_68 = (undefined1  [8])&propertySymOpnd;
  HandleBailout.instr = (Instr **)&HandleBailout.propertySymOpnd;
  HandleBailout.this = (GlobOpt *)auStack_38;
  HandleBailout.bailOutInfo = (BailOutInfo **)this;
  bVar4 = NeedsTypeCheckBailOut
                    ((Instr *)propertySymOpnd,_auStack_38,
                     (Opnd *)(propertySymOpnd->finalType).t == opnd,(bool *)((long)&instr_local + 7)
                     ,(BailOutKind *)((long)&bailOutInfo_local + 4));
  pPVar9 = _auStack_38;
  if (bVar4) {
LAB_004a3f1d:
    SetTypeCheckBailOut::anon_class_32_4_595ba12a::operator()
              ((anon_class_32_4_595ba12a *)local_68,bailOutInfo_local._4_4_);
    return (Instr *)propertySymOpnd;
  }
  if (*(short *)&propertySymOpnd->m_runtimePolymorphicInlineCache == 0x1f5) {
    bailOutInfo_local._4_4_ = BailOutFailedInlineTypeCheck;
    goto LAB_004a3f1d;
  }
  if (((ulong)propertySymOpnd->objTypeSpecFldInfo & 0x10) == 0) {
    return (Instr *)propertySymOpnd;
  }
  if (*(short *)&propertySymOpnd->m_runtimePolymorphicInlineCache == 0x270) {
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody
                        (*(JITTimeWorkItem **)(*(long *)&propertySymOpnd->m_inlineCacheIndex + 0x20)
                        );
    uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
    pFVar11 = JITTimeWorkItem::GetJITTimeInfo
                        (*(JITTimeWorkItem **)(*(long *)&propertySymOpnd->m_inlineCacheIndex + 0x20)
                        );
    uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,FixedMethodsPhase,uVar5,uVar6);
    if (bVar4) {
      pJVar10 = JITTimeWorkItem::GetJITFunctionBody
                          (*(JITTimeWorkItem **)
                            (*(long *)&propertySymOpnd->m_inlineCacheIndex + 0x20));
      uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
      pFVar11 = JITTimeWorkItem::GetJITTimeInfo
                          (*(JITTimeWorkItem **)
                            (*(long *)&propertySymOpnd->m_inlineCacheIndex + 0x20));
      uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,UseFixedDataPropsPhase,uVar5,uVar6);
      if (bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                           ,0x704,
                           "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::FixedMethodsPhase)), ((instr->m_func)->GetSourceContextId()), ((instr->m_func)->GetLocalFunctionId())) || !Js::Configuration::Global.flags.Off.IsEnabled(((Js::UseFixedDataPropsPhase)), ((instr->m_func)->GetSourceContextId()), ((instr->m_func)->GetLocalFunctionId())))"
                           ,"CheckFixedFld with fixed method/data phase disabled?");
        if (!bVar4) goto LAB_004a41b2;
        *puVar8 = 0;
      }
    }
    if (instr_local._7_1_ == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x705,"(isTypeCheckProtected)","isTypeCheckProtected");
      if (!bVar4) goto LAB_004a41b2;
      *puVar8 = 0;
    }
    BVar7 = IR::Instr::GetBailOutKind((Instr *)propertySymOpnd);
    if ((BVar7 == BailOutFailedFixedFieldTypeCheck) ||
       (BVar7 = IR::Instr::GetBailOutKind((Instr *)propertySymOpnd),
       BVar7 == BailOutFailedEquivalentFixedFieldTypeCheck)) goto LAB_004a41a4;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    error = 
    "(instr->GetBailOutKind() == IR::BailOutFailedFixedFieldTypeCheck || instr->GetBailOutKind() == IR::BailOutFailedEquivalentFixedFieldTypeCheck)"
    ;
    message = 
    "Only BailOutFailed[Equivalent]FixedFieldTypeCheck can be safely removed.  Why does CheckFixedFld carry a different bailout kind?."
    ;
    uVar5 = 0x707;
  }
  else {
    if (_auStack_38->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
      return (Instr *)propertySymOpnd;
    }
    bVar4 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(_auStack_38);
    pPVar2 = _auStack_38;
    if ((!bVar4) && (((ushort)pPVar9->field_12 & 2) == 0)) {
      return (Instr *)propertySymOpnd;
    }
    bVar4 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(_auStack_38);
    if (!bVar4) {
      return (Instr *)propertySymOpnd;
    }
    if (((pPVar2->field_12).field_0.field_5.typeCheckSeqFlags & 8) == 0) {
      return (Instr *)propertySymOpnd;
    }
    BVar7 = IR::Instr::GetBailOutKind((Instr *)propertySymOpnd);
    if (BVar7 == BailOutMarkTempObject) goto LAB_004a41a4;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    error = "(instr->GetBailOutKind() == IR::BailOutMarkTempObject)";
    message = "instr->GetBailOutKind() == IR::BailOutMarkTempObject";
    uVar5 = 0x70e;
  }
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                     ,uVar5,error,message);
  if (!bVar4) {
LAB_004a41b2:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar8 = 0;
LAB_004a41a4:
  IR::Instr::ClearBailOutInfo((Instr *)propertySymOpnd);
  return (Instr *)propertySymOpnd;
}

Assistant:

IR::Instr *
GlobOpt::SetTypeCheckBailOut(IR::Opnd *opnd, IR::Instr *instr, BailOutInfo *bailOutInfo)
{
    if (this->IsLoopPrePass() || !opnd->IsSymOpnd())
    {
        return instr;
    }

    if (!opnd->AsSymOpnd()->IsPropertySymOpnd())
    {
        return instr;
    }

    IR::PropertySymOpnd * propertySymOpnd = opnd->AsPropertySymOpnd();

    AssertMsg(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate(), "Property sym operand optimized despite not being a candidate?");
    AssertMsg(bailOutInfo == nullptr || !instr->HasBailOutInfo(), "Why are we adding new bailout info to an instruction that already has it?");

    auto HandleBailout = [&](IR::BailOutKind bailOutKind)->void {
        // At this point, we have a cached type that is live downstream or the type check is required
        // for a fixed field load. If we can't do away with the type check, then we're going to need bailout,
        // so lets add bailout info if we don't already have it.
        if (!instr->HasBailOutInfo())
        {
            if (bailOutInfo)
            {
                instr = instr->ConvertToBailOutInstr(bailOutInfo, bailOutKind);
            }
            else
            {
                GenerateBailAtOperation(&instr, bailOutKind);
                BailOutInfo *bailOutInfo = instr->GetBailOutInfo();

                // Consider (ObjTypeSpec): If we're checking a fixed field here the bailout could be due to polymorphism or
                // due to a fixed field turning non-fixed. Consider distinguishing between the two.
                bailOutInfo->polymorphicCacheIndex = propertySymOpnd->m_inlineCacheIndex;
            }
        }
        else if (instr->GetBailOutKind() == IR::BailOutMarkTempObject)
        {
            Assert(!bailOutInfo);
            Assert(instr->GetBailOutInfo()->polymorphicCacheIndex == -1);
            instr->SetBailOutKind(bailOutKind | IR::BailOutMarkTempObject);
            instr->GetBailOutInfo()->polymorphicCacheIndex = propertySymOpnd->m_inlineCacheIndex;
        }
        else
        {
            Assert(bailOutKind == instr->GetBailOutKind());
        }
    };

    bool isTypeCheckProtected;
    IR::BailOutKind bailOutKind;
    if (GlobOpt::NeedsTypeCheckBailOut(instr, propertySymOpnd, opnd == instr->GetDst(), &isTypeCheckProtected, &bailOutKind))
    {
        HandleBailout(bailOutKind);
    }
    else
    {
        if (instr->m_opcode == Js::OpCode::LdMethodFromFlags)
        {
            // If LdMethodFromFlags is hoisted to the top of the loop, we should share the same bailout Info.
            // We don't need to do anything for LdMethodFromFlags that cannot be field hoisted.
            HandleBailout(IR::BailOutFailedInlineTypeCheck);
        }
        else if (instr->HasBailOutInfo())
        {
            // If we already have a bailout info, but don't actually need it, let's remove it. This can happen if
            // a CheckFixedFld added by the inliner (with bailout info) determined that the object's type has
            // been checked upstream and no bailout is necessary here.
            if (instr->m_opcode == Js::OpCode::CheckFixedFld)
            {
                AssertMsg(!PHASE_OFF(Js::FixedMethodsPhase, instr->m_func) ||
                    !PHASE_OFF(Js::UseFixedDataPropsPhase, instr->m_func), "CheckFixedFld with fixed method/data phase disabled?");
                Assert(isTypeCheckProtected);
                AssertMsg(instr->GetBailOutKind() == IR::BailOutFailedFixedFieldTypeCheck || instr->GetBailOutKind() == IR::BailOutFailedEquivalentFixedFieldTypeCheck,
                    "Only BailOutFailed[Equivalent]FixedFieldTypeCheck can be safely removed.  Why does CheckFixedFld carry a different bailout kind?.");
                instr->ClearBailOutInfo();
            }
            else if (propertySymOpnd->MayNeedTypeCheckProtection() && propertySymOpnd->IsTypeCheckProtected())
            {
                // Both the type and (if necessary) the proto object have been checked.
                // We're doing a direct slot access. No possibility of bailout here (not even implicit call).
                Assert(instr->GetBailOutKind() == IR::BailOutMarkTempObject);
                instr->ClearBailOutInfo();
            }
        }
    }

    return instr;
}